

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O3

void ImGui_ImplOpenGL3_RenderDrawData(ImDrawData *draw_data)

{
  undefined8 uVar1;
  ImDrawList *pIVar2;
  ImDrawCmd *pIVar3;
  code *pcVar4;
  undefined1 auVar5 [16];
  GLboolean GVar6;
  GLboolean GVar7;
  GLboolean GVar8;
  GLboolean GVar9;
  undefined4 in_EAX;
  int iVar10;
  uint uVar11;
  PFNGLENABLEPROC *pp_Var12;
  long lVar13;
  long lVar14;
  long lVar15;
  PFNGLENABLEPROC *pp_Var16;
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  GLuint vertex_array_object;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLint last_vertex_array_object;
  GLint last_array_buffer;
  GLint last_sampler;
  GLint last_texture;
  GLint last_program;
  GLenum last_active_texture;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLint last_polygon_mode [2];
  GLuint local_e0;
  float local_dc;
  GLenum local_d8;
  GLenum local_d4;
  GLenum local_d0;
  GLenum local_cc;
  GLenum local_c8;
  GLenum local_c4;
  GLuint local_c0;
  GLuint local_bc;
  GLuint local_b8;
  GLuint local_b4;
  GLuint local_b0;
  GLenum local_ac;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  GLint local_98;
  GLint local_94;
  GLsizei local_90;
  GLsizei local_8c;
  GLint local_88;
  GLint local_84;
  GLsizei local_80;
  GLsizei local_7c;
  GLenum local_70 [2];
  ImVec2 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar20 = (float)(int)((draw_data->FramebufferScale).x * (draw_data->DisplaySize).x);
  fVar23 = (float)(int)((draw_data->FramebufferScale).y * (draw_data->DisplaySize).y);
  auVar18._0_4_ = -(uint)(0 < (int)fVar20);
  auVar18._4_4_ = -(uint)(0 < (int)fVar20);
  auVar18._8_4_ = -(uint)(0 < (int)fVar23);
  auVar18._12_4_ = -(uint)(0 < (int)fVar23);
  iVar10 = movmskpd(in_EAX,auVar18);
  if (iVar10 == 3) {
    local_a8.y = fVar23;
    local_a8.x = fVar20;
    uStack_a0 = 0;
    (*glad_glGetIntegerv)(0x84e0,(GLint *)&local_ac);
    (*glad_glActiveTexture)(0x84c0);
    (*glad_glGetIntegerv)(0x8b8d,(GLint *)&local_b0);
    (*glad_glGetIntegerv)(0x8069,(GLint *)&local_b4);
    (*glad_glGetIntegerv)(0x8919,(GLint *)&local_b8);
    (*glad_glGetIntegerv)(0x8894,(GLint *)&local_bc);
    (*glad_glGetIntegerv)(0x85b5,(GLint *)&local_c0);
    (*glad_glGetIntegerv)(0xb40,(GLint *)local_70);
    (*glad_glGetIntegerv)(0xba2,&local_88);
    (*glad_glGetIntegerv)(0xc10,&local_98);
    (*glad_glGetIntegerv)(0x80c9,(GLint *)&local_c4);
    (*glad_glGetIntegerv)(0x80c8,(GLint *)&local_c8);
    (*glad_glGetIntegerv)(0x80cb,(GLint *)&local_cc);
    (*glad_glGetIntegerv)(0x80ca,(GLint *)&local_d0);
    (*glad_glGetIntegerv)(0x8009,(GLint *)&local_d4);
    (*glad_glGetIntegerv)(0x883d,(GLint *)&local_d8);
    GVar6 = (*glad_glIsEnabled)(0xbe2);
    GVar7 = (*glad_glIsEnabled)(0xb44);
    GVar8 = (*glad_glIsEnabled)(0xb71);
    GVar9 = (*glad_glIsEnabled)(0xc11);
    local_e0 = 0;
    (*glad_glGenVertexArrays)(1,&local_e0);
    fVar20 = local_a8.x;
    fVar23 = local_a8.y;
    ImGui_ImplOpenGL3_SetupRenderState(draw_data,(int)local_a8.x,(int)local_a8.y,local_e0);
    if (0 < draw_data->CmdListsCount) {
      local_a8 = draw_data->DisplayPos;
      local_68 = draw_data->FramebufferScale;
      local_48 = local_68.y;
      local_dc = (float)(int)fVar20;
      fVar21 = (float)(int)fVar23;
      uStack_60 = 0;
      uStack_a0 = 0;
      local_58 = local_a8.y;
      lVar14 = 0;
      fStack_54 = local_58;
      fStack_50 = local_58;
      fStack_4c = local_58;
      fStack_44 = local_48;
      fStack_40 = local_48;
      fStack_3c = local_48;
      do {
        pIVar2 = draw_data->CmdLists[lVar14];
        (*glad_glBufferData)
                  (0x8892,(long)(pIVar2->VtxBuffer).Size * 0x14,(pIVar2->VtxBuffer).Data,0x88e0);
        (*glad_glBufferData)
                  (0x8893,(long)(pIVar2->IdxBuffer).Size * 2,(pIVar2->IdxBuffer).Data,0x88e0);
        if (0 < (pIVar2->CmdBuffer).Size) {
          lVar13 = 0;
          lVar15 = 0;
          do {
            pIVar3 = (pIVar2->CmdBuffer).Data;
            pcVar4 = *(code **)((long)&pIVar3->UserCallback + lVar13);
            if (pcVar4 == (code *)0x0) {
              fVar17 = (*(float *)((long)&(pIVar3->ClipRect).x + lVar13) - local_a8.x) * local_68.x;
              if ((fVar17 < local_dc) &&
                 (fVar19 = (*(float *)((long)&(pIVar3->ClipRect).y + lVar13) - local_58) * local_48,
                 fVar19 < fVar21)) {
                uVar1 = *(undefined8 *)((long)&(pIVar3->ClipRect).z + lVar13);
                fVar22 = ((float)uVar1 - local_a8.x) * local_68.x;
                fVar24 = ((float)((ulong)uVar1 >> 0x20) - local_a8.y) * local_68.y;
                iVar10 = -(uint)(0.0 <= fVar22);
                auVar5._4_4_ = iVar10;
                auVar5._0_4_ = iVar10;
                auVar5._8_4_ = -(uint)(0.0 <= fVar24);
                auVar5._12_4_ = -(uint)(0.0 <= fVar24);
                uVar11 = movmskpd(0,auVar5);
                if (((uVar11 & 1) != 0) && ((byte)((byte)uVar11 >> 1) != 0)) {
                  (*glad_glScissor)((int)fVar17,(int)(fVar21 - fVar24),(int)(fVar22 - fVar17),
                                    (int)(fVar24 - fVar19));
                  (*glad_glBindTexture)(0xde1,*(GLuint *)((long)&pIVar3->TextureId + lVar13));
                  (*glad_glDrawElementsBaseVertex)
                            (4,*(GLsizei *)((long)&pIVar3->ElemCount + lVar13),0x1403,
                             (void *)((ulong)*(uint *)((long)&pIVar3->IdxOffset + lVar13) * 2),
                             *(GLint *)((long)&pIVar3->VtxOffset + lVar13));
                }
              }
            }
            else if (pcVar4 == (code *)0xffffffffffffffff) {
              ImGui_ImplOpenGL3_SetupRenderState(draw_data,(int)fVar20,(int)fVar23,local_e0);
            }
            else {
              (*pcVar4)(pIVar2,(long)&pIVar3->ElemCount + lVar13);
            }
            lVar15 = lVar15 + 1;
            lVar13 = lVar13 + 0x38;
          } while (lVar15 < (pIVar2->CmdBuffer).Size);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < draw_data->CmdListsCount);
    }
    (*glad_glDeleteVertexArrays)(1,&local_e0);
    (*glad_glUseProgram)(local_b0);
    (*glad_glBindTexture)(0xde1,local_b4);
    (*glad_glBindSampler)(0,local_b8);
    (*glad_glActiveTexture)(local_ac);
    (*glad_glBindVertexArray)(local_c0);
    (*glad_glBindBuffer)(0x8892,local_bc);
    (*glad_glBlendEquationSeparate)(local_d4,local_d8);
    (*glad_glBlendFuncSeparate)(local_c4,local_c8,local_cc,local_d0);
    pp_Var16 = &glad_glEnable;
    pp_Var12 = &glad_glEnable;
    if (GVar6 == '\0') {
      pp_Var12 = &glad_glDisable;
    }
    (**pp_Var12)(0xbe2);
    pp_Var12 = &glad_glEnable;
    if (GVar7 == '\0') {
      pp_Var12 = &glad_glDisable;
    }
    (**pp_Var12)(0xb44);
    pp_Var12 = &glad_glEnable;
    if (GVar8 == '\0') {
      pp_Var12 = &glad_glDisable;
    }
    (**pp_Var12)(0xb71);
    if (GVar9 == '\0') {
      pp_Var16 = &glad_glDisable;
    }
    (**pp_Var16)(0xc11);
    (*glad_glPolygonMode)(0x408,local_70[0]);
    (*glad_glViewport)(local_88,local_84,local_80,local_7c);
    (*glad_glScissor)(local_98,local_94,local_90,local_8c);
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width <= 0 || fb_height <= 0)
        return;

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, &last_program);
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
#ifdef GL_SAMPLER_BINDING
    GLint last_sampler; glGetIntegerv(GL_SAMPLER_BINDING, &last_sampler);
#endif
    GLint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_ES2
    GLint last_vertex_array_object; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, &last_vertex_array_object);
#endif
#ifdef GL_POLYGON_MODE
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
#endif
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);
    bool clip_origin_lower_left = true;
#if defined(GL_CLIP_ORIGIN) && !defined(__APPLE__)
    GLenum last_clip_origin = 0; glGetIntegerv(GL_CLIP_ORIGIN, (GLint*)&last_clip_origin); // Support for GL 4.5's glClipControl(GL_UPPER_LEFT)
    if (last_clip_origin == GL_UPPER_LEFT)
        clip_origin_lower_left = false;
#endif

    // Setup desired GL state
    // Recreate the VAO every time (this is to easily allow multiple GL contexts to be rendered to. VAO are not shared among GL contexts)
    // The renderer would actually work without any VAO bound, but then our VertexAttrib calls would overwrite the default one currently bound.
    GLuint vertex_array_object = 0;
#ifndef IMGUI_IMPL_OPENGL_ES2
    glGenVertexArrays(1, &vertex_array_object);
#endif
    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];

        // Upload vertex/index buffers
        glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)cmd_list->VtxBuffer.Size * sizeof(ImDrawVert), (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)cmd_list->IdxBuffer.Size * sizeof(ImDrawIdx), (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback != NULL)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    if (clip_origin_lower_left)
                        glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));
                    else
                        glScissor((int)clip_rect.x, (int)clip_rect.y, (int)clip_rect.z, (int)clip_rect.w); // Support for GL 4.5 rarely used glClipControl(GL_UPPER_LEFT)

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
#if IMGUI_IMPL_OPENGL_HAS_DRAW_WITH_BASE_VERTEX
                    glDrawElementsBaseVertex(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)), (GLint)pcmd->VtxOffset);
#else
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)));
#endif
                }
            }
        }
    }

    // Destroy the temporary VAO
#ifndef IMGUI_IMPL_OPENGL_ES2
    glDeleteVertexArrays(1, &vertex_array_object);
#endif

    // Restore modified GL state
    glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
#ifdef GL_SAMPLER_BINDING
    glBindSampler(0, last_sampler);
#endif
    glActiveTexture(last_active_texture);
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(last_vertex_array_object);
#endif
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]);
#endif
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
}